

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_block_elim_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::LocalSingleBlockLoadStoreElimPass::ProcessImpl
          (LocalSingleBlockLoadStoreElimPass *this)

{
  bool bVar1;
  Op OVar2;
  IRContext *pIVar3;
  FeatureManager *this_00;
  anon_class_8_1_8991fb9c aStack_70;
  bool modified;
  undefined1 local_68 [8];
  ProcessFunction pfn;
  Instruction *ai;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  LocalSingleBlockLoadStoreElimPass *this_local;
  
  pIVar3 = Pass::context((Pass *)this);
  this_00 = IRContext::get_feature_mgr(pIVar3);
  bVar1 = FeatureManager::HasCapability(this_00,Addresses);
  if (bVar1) {
    this_local._4_4_ = SuccessWithoutChange;
  }
  else {
    Pass::get_module((Pass *)this);
    Module::annotations((Module *)&__begin2);
    IteratorRange<spvtools::opt::InstructionList::iterator>::begin
              ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
    IteratorRange<spvtools::opt::InstructionList::iterator>::end
              ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&ai);
    while (bVar1 = utils::operator!=(&__end2.super_iterator,
                                     (iterator_template<spvtools::opt::Instruction> *)&ai), bVar1) {
      pfn._M_invoker =
           (_Invoker_type)
           utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
      OVar2 = opt::Instruction::opcode((Instruction *)pfn._M_invoker);
      if (OVar2 == OpGroupDecorate) {
        return SuccessWithoutChange;
      }
      InstructionList::iterator::operator++(&__end2);
    }
    bVar1 = AllExtensionsSupported(this);
    if (bVar1) {
      aStack_70.this = this;
      std::function<bool(spvtools::opt::Function*)>::
      function<spvtools::opt::LocalSingleBlockLoadStoreElimPass::ProcessImpl()::__0,void>
                ((function<bool(spvtools::opt::Function*)> *)local_68,&stack0xffffffffffffff90);
      pIVar3 = Pass::context((Pass *)this);
      bVar1 = IRContext::ProcessReachableCallTree(pIVar3,(ProcessFunction *)local_68);
      this_local._4_4_ = SuccessWithoutChange;
      if (bVar1) {
        this_local._4_4_ = SuccessWithChange;
      }
      std::function<bool_(spvtools::opt::Function_*)>::~function
                ((function<bool_(spvtools::opt::Function_*)> *)local_68);
    }
    else {
      this_local._4_4_ = SuccessWithoutChange;
    }
  }
  return this_local._4_4_;
}

Assistant:

Pass::Status LocalSingleBlockLoadStoreElimPass::ProcessImpl() {
  // Assumes relaxed logical addressing only (see instruction.h).
  if (context()->get_feature_mgr()->HasCapability(spv::Capability::Addresses))
    return Status::SuccessWithoutChange;

  // Do not process if module contains OpGroupDecorate. Additional
  // support required in KillNamesAndDecorates().
  // TODO(greg-lunarg): Add support for OpGroupDecorate
  for (auto& ai : get_module()->annotations())
    if (ai.opcode() == spv::Op::OpGroupDecorate)
      return Status::SuccessWithoutChange;
  // If any extensions in the module are not explicitly supported,
  // return unmodified.
  if (!AllExtensionsSupported()) return Status::SuccessWithoutChange;
  // Process all entry point functions
  ProcessFunction pfn = [this](Function* fp) {
    return LocalSingleBlockLoadStoreElim(fp);
  };

  bool modified = context()->ProcessReachableCallTree(pfn);
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}